

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void cppcms::xss::anon_unknown_8::parse_part(entry *part)

{
  undefined8 *puVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  pointer ppVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  ulong uVar11;
  pointer ppVar12;
  ulong uVar13;
  byte *pbVar14;
  pointer ppVar15;
  long lVar16;
  int __base;
  char *p;
  byte *pbVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  pointer ppVar21;
  byte *pbVar22;
  byte *local_58;
  byte *local_50;
  entry *local_48;
  ulong local_40;
  pointer local_38;
  
  if (part->type == html_tag) {
    pcVar3 = part->begin;
    pcVar4 = part->end;
    pbVar19 = (byte *)(pcVar3 + 1);
    pbVar14 = (byte *)(pcVar4 + -1);
    if (pbVar19 < pbVar14) {
      bVar2 = *pbVar19;
      if (bVar2 == 0x2f) {
        if ((pcVar3[2] == 0x5f) || ((byte)((pcVar3[2] & 0xdfU) + 0xbf) < 0x1a)) {
          for (pbVar19 = (byte *)(pcVar3 + 3);
              (pbVar19 != pbVar14 &&
              (((byte)(*pbVar19 - 0x30) < 10 || ((byte)((*pbVar19 & 0xdf) + 0xbf) < 0x1a))));
              pbVar19 = pbVar19 + 1) {
          }
          pbVar17 = pbVar19;
          while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0)))
          {
            pbVar17 = pbVar17 + 1;
          }
          if (pbVar17 == pbVar14) {
            (part->tag).tag_begin = pcVar3 + 2;
            (part->tag).tag_end = (char *)pbVar19;
            part->type = close_tag;
            return;
          }
        }
      }
      else if ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
        (part->tag).tag_begin = (char *)pbVar19;
        do {
          do {
            pbVar17 = pbVar19 + 1;
            pbVar19 = pbVar19 + 1;
          } while ((byte)(*pbVar17 - 0x30) < 10);
        } while ((byte)((*pbVar17 & 0xdf) + 0xbf) < 0x1a);
        (part->tag).tag_end = (char *)pbVar19;
        if (pcVar4[-2] == '/') {
          pbVar14 = (byte *)(pcVar4 + -2);
        }
        part->type = (uint)(pcVar4[-2] == '/') * 2 + open_tag;
        if (pbVar14 <= pbVar19) {
          return;
        }
        bVar10 = true;
        local_50 = pbVar14;
        local_48 = part;
        do {
          bVar2 = *pbVar19;
          if (((ulong)bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar17 = pbVar19 + 1;
            bVar10 = true;
          }
          else {
            if ((!bVar10) || ((bVar2 != 0x5f && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))))) break;
            pbVar14 = pbVar19 + 2;
            pbVar17 = pbVar19;
            do {
              do {
                pbVar22 = pbVar17;
                pbVar20 = pbVar14;
                pbVar17 = pbVar22 + 1;
                pbVar14 = pbVar20 + 1;
              } while ((byte)(*pbVar22 - 0x30) < 10);
            } while ((byte)((*pbVar22 & 0xdf) + 0xbf) < 0x1a);
            ppVar5 = (part->tag).properties.
                     super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar5 == (part->tag).properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ppVar21 = (part->tag).properties.
                        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar16 = (long)ppVar5 - (long)ppVar21;
              if (lVar16 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar11 = lVar16 >> 5;
              uVar13 = uVar11;
              if (ppVar5 == ppVar21) {
                uVar13 = 1;
              }
              local_40 = uVar13 + uVar11;
              if (0x3fffffffffffffe < local_40) {
                local_40 = 0x3ffffffffffffff;
              }
              if (CARRY8(uVar13,uVar11)) {
                local_40 = 0x3ffffffffffffff;
              }
              local_40 = local_40 << 5;
              local_38 = ppVar21;
              ppVar12 = (pointer)operator_new(local_40);
              part = local_48;
              *(byte **)((long)ppVar12 + lVar16) = pbVar19;
              *(byte **)((long)ppVar12 + lVar16 + 8) = pbVar22;
              puVar1 = (undefined8 *)((long)ppVar12 + lVar16 + 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              ppVar21 = ppVar12;
              for (ppVar15 = local_38; ppVar5 != ppVar15; ppVar15 = ppVar15 + 1) {
                uVar6 = *(undefined4 *)&ppVar15->property_begin;
                uVar7 = *(undefined4 *)((long)&ppVar15->property_begin + 4);
                uVar8 = *(undefined4 *)&ppVar15->property_end;
                uVar9 = *(undefined4 *)((long)&ppVar15->property_end + 4);
                pcVar3 = ppVar15->value_end;
                ppVar21->value_begin = ppVar15->value_begin;
                ppVar21->value_end = pcVar3;
                *(undefined4 *)&ppVar21->property_begin = uVar6;
                *(undefined4 *)((long)&ppVar21->property_begin + 4) = uVar7;
                *(undefined4 *)&ppVar21->property_end = uVar8;
                *(undefined4 *)((long)&ppVar21->property_end + 4) = uVar9;
                ppVar21 = ppVar21 + 1;
              }
              if (local_38 != (pointer)0x0) {
                operator_delete(local_38);
              }
              ppVar21 = ppVar21 + 1;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar12;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar21;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((long)&ppVar12->property_begin + local_40);
            }
            else {
              ppVar5->property_begin = (char *)pbVar19;
              ppVar5->property_end = (char *)pbVar22;
              ppVar5->value_begin = (char *)0x0;
              ppVar5->value_end = (char *)0x0;
              ppVar21 = (part->tag).properties.
                        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 1;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar21;
            }
            pbVar14 = local_50;
            uVar13 = (ulong)*pbVar22;
            if (0x3d < uVar13) break;
            bVar10 = true;
            if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
              if ((uVar13 != 0x3d) || ((bVar2 = *pbVar17, bVar2 != 0x27 && (bVar2 != 0x22)))) break;
              pbVar22 = pbVar22 + 2;
              if (pbVar22 < local_50) {
                lVar16 = 2;
                do {
                  pbVar17 = pbVar20;
                  if (*pbVar20 == bVar2) break;
                  lVar16 = lVar16 + 1;
                  pbVar20 = pbVar20 + 1;
                  pbVar17 = local_50;
                } while (pbVar20 < local_50);
                if (pbVar17 == local_50) break;
                pbVar19 = pbVar22;
                if (lVar16 != 2) {
                  do {
                    bVar2 = *pbVar19;
                    if (bVar2 == 0x26) {
                      local_58 = pbVar19 + 1;
                      bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"amp;");
                      if ((((!bVar10) &&
                           (bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"lt;"), !bVar10))
                          && (bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"gt;"), !bVar10)
                          ) && (((bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"quot;"),
                                 !bVar10 &&
                                 (bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"apos;"),
                                 !bVar10)) &&
                                ((bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"#x27;"),
                                 !bVar10 &&
                                 ((bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"#X27;"),
                                  !bVar10 &&
                                  (bVar10 = ends_with((char **)&local_58,(char *)pbVar17,"#39;"),
                                  !bVar10)))))))) goto LAB_0021f514;
                    }
                    else {
                      if ((bVar2 == 0x3c) || (bVar2 == 0x3e)) goto LAB_0021f514;
                      local_58 = pbVar19 + 1;
                    }
                    pbVar19 = local_58;
                  } while (local_58 != pbVar17);
                  ppVar21 = (part->tag).properties.
                            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
              else {
                pbVar17 = pbVar22;
                if (pbVar22 == local_50) break;
              }
              ppVar21[-1].value_begin = (char *)pbVar22;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].value_end = (char *)pbVar17;
              pbVar17 = pbVar17 + 1;
              bVar10 = false;
            }
          }
          pbVar19 = pbVar17;
          if (pbVar14 <= pbVar17) {
            return;
          }
        } while( true );
      }
    }
  }
  else {
    if (part->type != html_entity) {
      return;
    }
    pcVar3 = part->begin;
    pbVar19 = (byte *)(pcVar3 + 1);
    pbVar14 = (byte *)(part->end + -1);
    if (pbVar19 < pbVar14) {
      pbVar17 = pbVar19;
      if (*pbVar19 == 0x23) {
        local_58 = (byte *)0x0;
        part->type = html_numeric_entity;
        pbVar19 = (byte *)(pcVar3 + 2);
        if (pbVar19 != pbVar14) {
          pbVar17 = pbVar19;
          if ((*pbVar19 | 0x20) == 0x78) {
            pbVar19 = (byte *)(pcVar3 + 3);
            pbVar17 = pbVar19;
            if (pbVar19 == pbVar14) goto LAB_0021f514;
            do {
              if ((9 < (byte)(*pbVar17 - 0x30)) &&
                 ((uVar18 = *pbVar17 - 0x41, 0x25 < uVar18 ||
                  ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) goto LAB_0021f514;
              pbVar17 = pbVar17 + 1;
            } while (pbVar17 != pbVar14);
            __base = 0x10;
          }
          else {
            do {
              if (9 < (byte)(*pbVar17 - 0x30)) goto LAB_0021f514;
              pbVar17 = pbVar17 + 1;
            } while (pbVar17 != pbVar14);
            __base = 10;
          }
          uVar13 = strtol((char *)pbVar19,(char **)&local_58,__base);
          if (((local_58 != (byte *)0x0) && ((long)uVar13 < 0x110000 && *local_58 == 0x3b)) &&
             (0x20 < uVar13 - 0x7f &&
              ((uVar13 & 0xfffffffffffffffe) != 0xfffe && (uVar13 & 0xfffffffffffffc00) != 0xd800)))
          {
            if (0x1f < (long)uVar13) {
              return;
            }
            if ((8 < (long)uVar13) && (uVar13 == 0xd || 0xfffffffffffffffd < uVar13 - 0xb)) {
              return;
            }
          }
        }
      }
      else {
        while (((byte)(*pbVar17 - 0x30) < 10 || ((byte)((*pbVar17 & 0xdf) + 0xbf) < 0x1a))) {
          pbVar17 = pbVar17 + 1;
          if (pbVar17 == pbVar14) {
            (part->tag).tag_begin = (char *)pbVar19;
            (part->tag).tag_end = (char *)pbVar14;
            return;
          }
        }
      }
    }
  }
LAB_0021f514:
  part->type = invalid_data;
  return;
}

Assistant:

void parse_part(entry &part)
		{
			switch(part.type) {
			case html_entity:
				parse_html_entity(part);
				break;
			case html_tag:
				parse_html_tag(part);
				break;
			default:
				/* Nothing to do in other cases */ ;
			}
		}